

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring_bitmap_t * roaring_bitmap_copy(roaring_bitmap_t *r)

{
  uint uVar1;
  _Bool _Var2;
  roaring_array_t *dest;
  void **ppvVar3;
  uint uVar4;
  ulong uVar5;
  
  dest = (roaring_array_t *)(*global_memory_hook.malloc)(0x28);
  if (dest != (roaring_array_t *)0x0) {
    uVar1 = (r->high_low_container).size;
    dest->keys = (uint16_t *)0x0;
    dest->typecodes = (uint8_t *)0x0;
    dest->size = 0;
    dest->allocation_size = 0;
    dest->containers = (void **)0x0;
    dest->flags = '\0';
    uVar4 = 0x10000;
    if (uVar1 < 0x10000) {
      uVar4 = uVar1;
    }
    if (uVar1 != 0) {
      uVar5 = (ulong)uVar4;
      ppvVar3 = (void **)(*global_memory_hook.malloc)(uVar5 * 0xb);
      if (ppvVar3 == (void **)0x0) {
        (*global_memory_hook.free)(dest);
        return (roaring_bitmap_t *)0x0;
      }
      dest->containers = ppvVar3;
      dest->keys = (uint16_t *)(ppvVar3 + uVar5);
      dest->typecodes = (uint8_t *)((long)(ppvVar3 + uVar5) + uVar5 * 2);
      dest->allocation_size = uVar4;
    }
    _Var2 = ra_overwrite(&r->high_low_container,dest,(_Bool)((r->high_low_container).flags & 1));
    if (_Var2) {
      dest->flags = dest->flags & 0xfe | (r->high_low_container).flags & 1;
      return (roaring_bitmap_t *)dest;
    }
    roaring_bitmap_free((roaring_bitmap_t *)dest);
  }
  return (roaring_bitmap_t *)0x0;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_copy(const roaring_bitmap_t *r) {
    roaring_bitmap_t *ans =
        (roaring_bitmap_t *)roaring_malloc(sizeof(roaring_bitmap_t));
    if (!ans) {
        return NULL;
    }
    if (!ra_init_with_capacity(  // allocation of list of containers can fail
            &ans->high_low_container, r->high_low_container.size)) {
        roaring_free(ans);
        return NULL;
    }
    if (!ra_overwrite(  // memory allocation of individual containers may fail
            &r->high_low_container, &ans->high_low_container, is_cow(r))) {
        roaring_bitmap_free(ans);  // overwrite should leave in freeable state
        return NULL;
    }
    roaring_bitmap_set_copy_on_write(ans, is_cow(r));
    return ans;
}